

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

shared_ptr<helics::helicsCLI11App> __thiscall helics::apps::Tracer::buildArgParserApp(Tracer *this)

{
  App *pAVar1;
  Option *pOVar2;
  App *this_00;
  Option *pOVar3;
  Option *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *func;
  Option *pOVar4;
  Option *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar5;
  Option_group *capture_group;
  Option_group *clone_group;
  shared_ptr<helics::helicsCLI11App> *app;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffa88;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffa90;
  char (*in_stack_fffffffffffffaa8) [40];
  allocator<char> *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffae8;
  undefined1 value;
  Option *in_stack_fffffffffffffaf0;
  char (*in_stack_fffffffffffffb30) [133];
  string *in_stack_fffffffffffffb38;
  App *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  string *group_name;
  App *in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffb58;
  App *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  allocator<char> local_379 [80];
  allocator<char> local_329 [80];
  undefined1 local_2d9 [80];
  allocator<char> local_289 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  string local_231 [2];
  allocator<char> local_1e1 [80];
  allocator<char> local_191 [40];
  allocator<char> local_169 [40];
  allocator<char> local_141 [33];
  App *local_120;
  allocator<char> local_111 [40];
  allocator<char> local_e9 [40];
  allocator<char> local_c1 [40];
  allocator<char> local_99 [40];
  allocator<char> local_71 [56];
  allocator<char> local_39 [40];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_shared<helics::helicsCLI11App,char_const(&)[40]>(in_stack_fffffffffffffaa8);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x23fa7b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,(bool *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  CLI::Option::ignore_underscore<CLI::App>
            (in_stack_fffffffffffffaf0,SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_71);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_39);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x23fb83);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,(bool *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_c1);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_99);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x23fc6f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,(bool *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_111);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_e9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x23fd5b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  pAVar1 = &CLI::App::add_option_group<CLI::Option_group>
                      (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                       (string *)in_stack_fffffffffffffb40)->super_App;
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_169);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_141);
  local_120 = pAVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  CLI::App::add_option<const_char[52],_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (char (*) [52])in_stack_fffffffffffffb30);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Tracer::buildArgParserApp()::__0,void>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  pOVar2 = CLI::Option::each(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  pOVar2 = CLI::OptionBase<CLI::Option>::delimiter(&pOVar2->super_OptionBase<CLI::Option>,',');
  CLI::Option::type_size(pOVar2,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x23ff26);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  CLI::App::add_option<const_char[99],_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (char (*) [99])in_stack_fffffffffffffb30);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Tracer::buildArgParserApp()::__1,void>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  pOVar2 = CLI::Option::each(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  CLI::OptionBase<CLI::Option>::delimiter(&pOVar2->super_OptionBase<CLI::Option>,',');
  this_00 = (App *)CLI::Option::ignore_underscore<CLI::App>
                             (in_stack_fffffffffffffaf0,
                              SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
  CLI::Option::type_size((Option *)this_00,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x24004e);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_1e1);
  group_name = local_231;
  pAVar1 = local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  pOVar3 = CLI::App::add_option<const_char[133],_(CLI::detail::enabler)0>
                     (pAVar1,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Tracer::buildArgParserApp()::__2,void>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  this_01 = CLI::Option::each(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  value = (undefined1)((ulong)in_stack_fffffffffffffae8 >> 0x38);
  CLI::OptionBase<CLI::Option>::delimiter(&this_01->super_OptionBase<CLI::Option>,',');
  pOVar2 = CLI::Option::ignore_underscore<CLI::App>(in_stack_fffffffffffffaf0,(bool)value);
  CLI::Option::type_size(pOVar2,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x240176);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator((allocator<char> *)local_231);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x24019d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  func = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::App::add_option_group<CLI::Option_group>(this_00,group_name,(string *)pAVar1);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator((allocator<char> *)(local_2d9 + 0x28));
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_289);
  pOVar2 = (Option *)local_2d9;
  local_268 = func;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  CLI::App::add_option<const_char[81],_(CLI::detail::enabler)0>
            (pAVar1,(string *)pOVar3,(char (*) [81])this_01);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Tracer::buildArgParserApp()::__3,void>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  pOVar4 = CLI::Option::each(pOVar2,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)func);
  CLI::Option::type_size(pOVar4,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x24032e);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator((allocator<char> *)local_2d9);
  pbVar6 = local_268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar6,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  pOVar4 = CLI::App::add_option<const_char[67],_(CLI::detail::enabler)0>
                     (pAVar1,(string *)pOVar3,(char (*) [67])this_01);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Tracer::buildArgParserApp()::__4,void>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  this_02 = CLI::Option::each(pOVar2,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      *)func);
  CLI::Option::type_size(this_02,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x240400);
  std::__cxx11::string::~string(in_stack_fffffffffffffa80);
  std::allocator<char>::~allocator(local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar6,(char *)pOVar4,(allocator<char> *)this_02);
  pOVar3 = CLI::App::add_option<const_char[139],_(CLI::detail::enabler)0>
                     (pAVar1,(string *)pOVar3,(char (*) [139])this_01);
  pbVar6 = &local_3a0;
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Tracer::buildArgParserApp()::__5,void>
            ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)pOVar3,in_stack_fffffffffffffa88);
  pOVar2 = CLI::Option::each(pOVar2,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)func);
  CLI::Option::type_size(pOVar2,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x2404d2);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(local_379);
  sVar5.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar5.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> Tracer::buildArgParserApp()
{
    using gmlc::utilities::stringOps::removeQuotes;
    using gmlc::utilities::stringOps::splitlineQuotes;

    auto app = std::make_shared<helicsCLI11App>("Command line options for the Tracer App");
    app->add_flag("--allow_iteration", allow_iteration, "allow iteration on values")
        ->ignore_underscore();
    app->add_flag("--print", printMessage, "print messages to the screen");
    app->add_flag("--skiplog", skiplog, "print messages to the screen through cout");
    auto* clone_group =
        app->add_option_group("cloning",
                              "Options related to endpoint cloning operations and specifications");
    clone_group->add_option("--clone", "existing endpoints to clone all packets to and from")
        ->each([this](const std::string& clone) {
            addDestEndpointClone(clone);
            addSourceEndpointClone(clone);
        })
        ->delimiter(',')
        ->type_size(-1);

    clone_group
        ->add_option(
            "--sourceclone",
            "existing endpoints to capture generated packets from, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    clone_group
        ->add_option("--destclone",
                     "existing endpoints to capture all packets with the specified endpoint as a "
                     "destination, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    auto* capture_group =
        app->add_option_group("capture_group",
                              "Options related to capturing publications, endpoints, or federates");
    capture_group
        ->add_option(
            "--tag,--publication,--pub",
            "tags(publications) to record, this argument may be specified any number of times")
        ->each([this](const std::string& tag) {
            auto taglist = splitlineQuotes(tag);
            for (const auto& tagname : taglist) {
                subkeys.emplace(removeQuotes(tagname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--endpoints",
                     "endpoints to capture, this argument may be specified multiple time")
        ->each([this](const std::string& ept) {
            auto eptlist = splitlineQuotes(ept);
            for (const auto& eptname : eptlist) {
                eptNames.emplace(removeQuotes(eptname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--capture",
                     "capture all the publications of a particular federate capture=\"fed1;fed2\"  "
                     "supports multiple arguments or a semicolon/comma separated list")
        ->each([this](const std::string& capt) {
            auto captFeds = splitlineQuotes(capt);
            for (auto& captFed : captFeds) {
                auto actCapt = removeQuotes(captFed);
                captureInterfaces.push_back(actCapt);
            }
        })
        ->type_size(-1);

    return app;
}